

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::set
          (Compiler *this,Ptr *node,Class *p,uint16_t write_index,uint16_t *extent_index,bool write)

{
  ImageObject *pIVar1;
  element_type *peVar2;
  pointer psVar3;
  short sVar4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  Atom *pAVar8;
  ssize_t sVar9;
  uint16_t j;
  ushort uVar10;
  ushort uVar11;
  long lVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Class *this_01;
  undefined7 in_register_00000089;
  uint16_t *extent_index_00;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  Class _p;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_120;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_e0;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string label;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  extent_index_00 = (uint16_t *)CONCAT71(in_register_00000089,write);
  uVar16 = (uint)extent_index_00;
  label._M_dataplus._M_p = (pointer)&label.field_2;
  label._M_string_length = 0;
  label.field_2._M_local_buf[0] = '\0';
  bVar5 = std::operator!=(&((node->
                            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->label,"");
  if (bVar5) {
    std::__cxx11::string::substr
              ((ulong)&_p,
               (ulong)&((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->label);
    std::__cxx11::string::operator=((string *)&label,(string *)&_p);
    std::__cxx11::string::~string((string *)&_p);
    std::__cxx11::string::string((string *)&local_50,(string *)&label);
    bVar5 = addLocalReference(this,&local_50,write_index,p);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar5) goto LAB_00134e1e;
    std::__cxx11::string::find((char *)&label,0x14675f);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)&label);
    std::operator+(&local_b0,"cast to ",&local_70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_p,
                   &local_b0,": unknown class");
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_c0,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
    ;
    set_error(this,(string *)&_p,(Ptr *)&local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
    std::__cxx11::string::~string((string *)&_p);
    std::__cxx11::string::~string((string *)&local_b0);
    this_01 = (Class *)&local_70;
LAB_001352f5:
    std::__cxx11::string::~string((string *)this_01);
LAB_0013534b:
    bVar5 = false;
  }
  else {
LAB_00134e1e:
    if (write) {
      r_code::Atom::IPointer((ushort)&_p);
      pAVar8 = r_code::vector<r_code::Atom>::operator[]
                         ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
      r_code::Atom::operator=(pAVar8,&_p.atom);
      r_code::Atom::~Atom(&_p.atom);
      cVar6 = r_code::Atom::getDescriptor();
      if ((cVar6 == -0x3e) && (p->use_as != I_SET)) {
        bVar7 = r_code::Atom::getAtomCount();
        pIVar1 = this->current_object;
        uVar10 = *extent_index;
        *extent_index = uVar10 + 1;
        pAVar8 = r_code::vector<r_code::Atom>::operator[]
                           ((vector<r_code::Atom> *)(pIVar1 + 8),(ulong)uVar10);
        r_code::Atom::operator=(pAVar8,&p->atom);
      }
      else {
        peVar2 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        bVar7 = (byte)((ulong)((long)(peVar2->args).
                                     super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(peVar2->args).
                                    super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
        r_code::Atom::Set((uchar)&_p);
        pIVar1 = this->current_object;
        uVar10 = *extent_index;
        *extent_index = uVar10 + 1;
        pAVar8 = r_code::vector<r_code::Atom>::operator[]
                           ((vector<r_code::Atom> *)(pIVar1 + 8),(ulong)uVar10);
        r_code::Atom::operator=(pAVar8,&_p.atom);
        r_code::Atom::~Atom(&_p.atom);
      }
      uVar10 = *extent_index;
      *extent_index = bVar7 + uVar10;
    }
    else {
      uVar10 = 0;
    }
    if (p->use_as == I_CLASS) {
      bVar7 = r_code::Atom::getAtomCount();
      uVar14 = (uint)bVar7;
      if (write) {
        for (uVar11 = uVar10; (uint)uVar11 < (uint)uVar10 + (uint)bVar7; uVar11 = uVar11 + 1) {
          r_code::Atom::Wildcard((ushort)&_p);
          pAVar8 = r_code::vector<r_code::Atom>::operator[]
                             ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)uVar11);
          r_code::Atom::operator=(pAVar8,&_p.atom);
          r_code::Atom::~Atom(&_p.atom);
        }
      }
    }
    else {
      uVar14 = 0xffffffff;
    }
    if ((uVar14 != 0xffffffff) &&
       (peVar2 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
       (long)(peVar2->args).
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(peVar2->args).
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4 != (ulong)uVar14)) {
      if ((this->state).no_arity_check != true) {
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_d0,
                   &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        peVar2 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        set_arity_error(this,(Ptr *)&local_d0,(uint16_t)uVar14,
                        (uint16_t)
                        ((uint)(*(int *)&(peVar2->args).
                                         super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                               *(int *)&(peVar2->args).
                                        super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
        goto LAB_0013534b;
      }
      (this->state).no_arity_check = false;
    }
    lVar12 = 0;
    lVar15 = 0;
    uVar13 = 0;
    while( true ) {
      peVar2 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar3 = (peVar2->args).
               super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(peVar2->args).
                        super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4) <= uVar13)
      break;
      sVar4 = (short)uVar13;
      switch(p->use_as) {
      case I_CLASS:
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_100,
                   (__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&psVar3->
                           super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> +
                   lVar15));
        extent_index_00 = extent_index;
        sVar9 = read(this,(int)&local_100,
                     (void *)((long)&((p->things_to_read).
                                      super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_read + lVar12),1)
        ;
        cVar6 = (char)sVar9;
        this_00 = &local_100._M_refcount;
        break;
      case I_EXPRESSION:
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_e0,
                   (__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&psVar3->
                           super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> +
                   lVar15));
        extent_index_00 = extent_index;
        cVar6 = read_expression(this,(Ptr *)&local_e0,true,p,uVar10 + sVar4,extent_index,write);
        this_00 = &local_e0._M_refcount;
        break;
      case I_SET:
        Class::Class(&_p,p);
        _p.use_as = I_CLASS;
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_f0,
                   (__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((((node->
                              super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->args).
                            super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> +
                   lVar15));
        extent_index_00 = extent_index;
        bVar5 = read_set(this,(Ptr *)&local_f0,true,&_p,uVar10 + sVar4,extent_index,write);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
        Class::~Class(&_p);
        if (bVar5) goto switchD_0013510b_default;
        goto LAB_001352a3;
      case I_DCLASS:
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_110,
                   (__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&psVar3->
                           super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> +
                   lVar15));
        cVar6 = read_class(this,(Ptr *)&local_110,false,(Class *)(ulong)(uVar16 & 0xff),
                           uVar10 + sVar4,extent_index_00,write);
        this_00 = &local_110._M_refcount;
        break;
      default:
        goto switchD_0013510b_default;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
      if (cVar6 == '\0') {
LAB_001352a3:
        std::__cxx11::string::string
                  ((string *)&_p," error: illegal element in set",(allocator *)&local_b0);
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_120,
                   &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        set_error(this,(string *)&_p,(Ptr *)&local_120);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
        this_01 = &_p;
        goto LAB_001352f5;
      }
switchD_0013510b_default:
      uVar13 = uVar13 + 1;
      lVar15 = lVar15 + 0x10;
      lVar12 = lVar12 + 0x60;
    }
    bVar5 = true;
  }
  std::__cxx11::string::~string((string *)&label);
  return bVar5;
}

Assistant:

bool Compiler::set(RepliStruct::Ptr node, const Class &p, uint16_t write_index, uint16_t &extent_index, bool write)
{
    bool lbl = false;
    std::string label;

    if (node->label != "") {
        label = node->label.substr(0, node->label.size() - 1);
        lbl = true;
    }

    if (lbl) {
        if (!addLocalReference(label, write_index, p)) {
            set_error("cast to " + label.substr(label.find("#") + 1) + ": unknown class", node);
            return false;
        }
    }

    uint16_t content_write_index = 0;

    if (write) {
        current_object->code[write_index] = Atom::IPointer(extent_index);
        uint8_t element_count;

        if (p.atom.getDescriptor() == Atom::S_SET && p.use_as != StructureMember::I_SET) {
            element_count = p.atom.getAtomCount();
            current_object->code[extent_index++] = p.atom;
        } else {
            element_count = node->args.size();//set_element_count(node);
            current_object->code[extent_index++] = Atom::Set(element_count);
        }

        content_write_index = extent_index;
        extent_index += element_count;
    }

    uint32_t arity = UINT32_MAX;

    if (p.use_as == StructureMember::I_CLASS) { // undefined arity for unstructured sets.
        arity = p.atom.getAtomCount();

        if (write) // fill up with wildcards that will be overwritten up to ::.
            for (uint16_t j = content_write_index; j < content_write_index + arity; ++j) {
                current_object->code[j] = Atom::Wildcard();
            }
    }

    if (node->args.size() != arity && arity != UINT32_MAX) {
        if (state.no_arity_check) {
            state.no_arity_check = false;
        } else {
            set_arity_error(node, arity, node->args.size());
            return false;
        }
    }

    for (size_t i = 0; i < node->args.size(); i++) {
        bool r;

        switch (p.use_as) {
        case StructureMember::I_EXPRESSION:
            r = read_expression(node->args[i], true, &p, content_write_index + i, extent_index, write);
            break;

        case StructureMember::I_SET: {
            Class _p = p;
            _p.use_as = StructureMember::I_CLASS;
            r = read_set(node->args[i], true, &_p, content_write_index + i, extent_index, write);
            break;
        }

        case StructureMember::I_CLASS:
            r = read(node->args[i], p.things_to_read[i], true, content_write_index + i, extent_index, write);
            break;

        case StructureMember::I_DCLASS:
            r = read_class(node->args[i], true, nullptr, content_write_index + i, extent_index, write);
            break;
        }

        if (!r) {
            set_error(" error: illegal element in set", node);
            return false;
        }
    }

    return true;
}